

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O0

sync_edges_t * __thiscall
tchecker::syncprod::vloc_edges_iterator_t::operator*
          (sync_edges_t *__return_storage_ptr__,vloc_edges_iterator_t *this)

{
  bool bVar1;
  values_iterator_t *pvVar2;
  edges_iterator_t *in_RCX;
  undefined1 local_e0 [24];
  edges_iterator_t end;
  undefined1 local_a0 [8];
  edges_iterator_t begin;
  undefined1 local_70 [8];
  edges_iterator_t end_1;
  edges_iterator_t begin_1;
  sync_edges_t sync_edges;
  vloc_edges_iterator_t *this_local;
  
  sync_edges.edges._end._it._M_current = (iterator)(iterator)this;
  bVar1 = at_end(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!at_end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/syncprod/edges_iterators.cc"
                  ,0xdc,
                  "vloc_edges_iterator_t::sync_edges_t tchecker::syncprod::vloc_edges_iterator_t::operator*()"
                 );
  }
  bVar1 = vloc_synchronized_edges_iterator_t::operator!=
                    (&this->_sync_it,(end_iterator_t *)&past_the_end_iterator);
  if (bVar1) {
    vloc_synchronized_edges_iterator_t::operator*((sync_edges_t *)&begin_1._sync_it,&this->_sync_it)
    ;
    pvVar2 = range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>::values_iterator_t>
             ::begin((range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>::values_iterator_t>
                      *)&sync_edges);
    edges_iterator_t::edges_iterator_t((edges_iterator_t *)&end_1._sync_it,pvVar2);
    pvVar2 = range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>::values_iterator_t>
             ::end((range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>::values_iterator_t>
                    *)&sync_edges);
    edges_iterator_t::edges_iterator_t((edges_iterator_t *)local_70,pvVar2);
    __return_storage_ptr__->sync_id = (sync_id_t)begin_1._sync_it._it._M_current;
    make_range<tchecker::syncprod::edges_iterator_t,tchecker::syncprod::edges_iterator_t>
              (&__return_storage_ptr__->edges,(tchecker *)&end_1._sync_it,
               (edges_iterator_t *)local_70,in_RCX);
    edges_iterator_t::~edges_iterator_t((edges_iterator_t *)local_70);
    edges_iterator_t::~edges_iterator_t((edges_iterator_t *)&end_1._sync_it);
  }
  else {
    join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
    ::operator*((join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
                 *)&end._sync_it);
    edges_iterator_t::edges_iterator_t
              ((edges_iterator_t *)local_a0,(edge_const_shared_ptr_t *)&end._sync_it,false);
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::edge_t> *)&end._sync_it);
    join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
    ::operator*((join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
                 *)local_e0);
    edges_iterator_t::edges_iterator_t
              ((edges_iterator_t *)(local_e0 + 0x10),(edge_const_shared_ptr_t *)local_e0,true);
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::edge_t> *)local_e0);
    __return_storage_ptr__->sync_id = 0xffffffff;
    make_range<tchecker::syncprod::edges_iterator_t,tchecker::syncprod::edges_iterator_t>
              (&__return_storage_ptr__->edges,(tchecker *)local_a0,
               (edges_iterator_t *)(local_e0 + 0x10),in_RCX);
    edges_iterator_t::~edges_iterator_t((edges_iterator_t *)(local_e0 + 0x10));
    edges_iterator_t::~edges_iterator_t((edges_iterator_t *)local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

vloc_edges_iterator_t::sync_edges_t vloc_edges_iterator_t::operator*()
{
  assert(!at_end());

  if (_sync_it != tchecker::past_the_end_iterator) {
    tchecker::syncprod::vloc_synchronized_edges_iterator_t::sync_edges_t sync_edges = *_sync_it;
    tchecker::syncprod::edges_iterator_t begin(sync_edges.edges.begin()), end(sync_edges.edges.end());
    return tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t{.sync_id = sync_edges.sync_id,
                                                                   .edges = tchecker::make_range(begin, end)};
  }

  tchecker::syncprod::edges_iterator_t begin(*_async_it, false), end(*_async_it, true);
  return tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t{.sync_id = tchecker::NO_SYNC,
                                                                 .edges = tchecker::make_range(begin, end)};
}